

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr_acl.c
# Opt level: O0

int netaddr_acl_copy(netaddr_acl *to,netaddr_acl *from)

{
  netaddr *pnVar1;
  netaddr_acl *from_local;
  netaddr_acl *to_local;
  
  netaddr_acl_remove(to);
  memcpy(to,from,0x28);
  if (to->accept_count != 0) {
    pnVar1 = (netaddr *)calloc(to->accept_count,0x12);
    to->accept = pnVar1;
    if (to->accept == (netaddr *)0x0) {
      return -1;
    }
    memcpy(to->accept,from->accept,to->accept_count * 0x12);
  }
  if (to->reject_count != 0) {
    pnVar1 = (netaddr *)calloc(to->reject_count,0x12);
    to->reject = pnVar1;
    if (to->reject == (netaddr *)0x0) {
      return -1;
    }
    memcpy(to->reject,from->reject,to->reject_count * 0x12);
  }
  return 0;
}

Assistant:

int
netaddr_acl_copy(struct netaddr_acl *to, const struct netaddr_acl *from) {
  netaddr_acl_remove(to);
  memcpy(to, from, sizeof(*to));

  if (to->accept_count) {
    to->accept = calloc(to->accept_count, sizeof(struct netaddr));
    if (to->accept == NULL) {
      return -1;
    }
    memcpy(to->accept, from->accept, to->accept_count * sizeof(struct netaddr));
  }

  if (to->reject_count) {
    to->reject = calloc(to->reject_count, sizeof(struct netaddr));
    if (to->reject == NULL) {
      return -1;
    }
    memcpy(to->reject, from->reject, to->reject_count * sizeof(struct netaddr));
  }
  return 0;
}